

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void set_entropy_context(MACROBLOCKD *xd,int mi_row,int mi_col,int num_planes)

{
  BLOCK_SIZE BVar1;
  long lVar2;
  int left_idx;
  int above_idx;
  BLOCK_SIZE bsize;
  macroblockd_plane *pd;
  int col_offset;
  int row_offset;
  int i;
  int num_planes_local;
  int mi_col_local;
  int mi_row_local;
  MACROBLOCKD *xd_local;
  
  col_offset = mi_col;
  row_offset = mi_row;
  for (i = 0; i < num_planes; i = i + 1) {
    lVar2 = (long)i;
    BVar1 = (*xd->mi)->bsize;
    if (((xd->plane[lVar2].subsampling_y != 0) && ((mi_row & 1U) != 0)) &&
       ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1] ==
        '\x01')) {
      row_offset = mi_row + -1;
    }
    if (((xd->plane[lVar2].subsampling_x != 0) && ((mi_col & 1U) != 0)) &&
       ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1] ==
        '\x01')) {
      col_offset = mi_col + -1;
    }
    xd->plane[lVar2].above_entropy_context =
         xd->above_entropy_context[i] +
         (col_offset >> ((byte)xd->plane[lVar2].subsampling_x & 0x1f));
    xd->plane[lVar2].left_entropy_context =
         xd->left_entropy_context[i] +
         ((int)(row_offset & 0x1fU) >> ((byte)xd->plane[lVar2].subsampling_y & 0x1f));
  }
  return;
}

Assistant:

static inline void set_entropy_context(MACROBLOCKD *xd, int mi_row, int mi_col,
                                       const int num_planes) {
  int i;
  int row_offset = mi_row;
  int col_offset = mi_col;
  for (i = 0; i < num_planes; ++i) {
    struct macroblockd_plane *const pd = &xd->plane[i];
    // Offset the buffer pointer
    const BLOCK_SIZE bsize = xd->mi[0]->bsize;
    if (pd->subsampling_y && (mi_row & 0x01) && (mi_size_high[bsize] == 1))
      row_offset = mi_row - 1;
    if (pd->subsampling_x && (mi_col & 0x01) && (mi_size_wide[bsize] == 1))
      col_offset = mi_col - 1;
    int above_idx = col_offset;
    int left_idx = row_offset & MAX_MIB_MASK;
    pd->above_entropy_context =
        &xd->above_entropy_context[i][above_idx >> pd->subsampling_x];
    pd->left_entropy_context =
        &xd->left_entropy_context[i][left_idx >> pd->subsampling_y];
  }
}